

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
          (KNearestNeighborsClassifier *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  KNearestNeighborsClassifier *this_local;
  
  bVar1 = has_defaultstringlabel(this);
  if (!bVar1) {
    clear_DefaultClassLabel(this);
    set_has_defaultstringlabel(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->DefaultClassLabel_).defaultstringlabel_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->DefaultClassLabel_).defaultstringlabel_,psVar2,value);
  return;
}

Assistant:

inline void KNearestNeighborsClassifier::set_defaultstringlabel(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel)
  if (!has_defaultstringlabel()) {
    clear_DefaultClassLabel();
    set_has_defaultstringlabel();
    DefaultClassLabel_.defaultstringlabel_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  DefaultClassLabel_.defaultstringlabel_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel)
}